

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

void __thiscall Reducer::reduceUsingPasses(Reducer *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  reference pbVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a10;
  string local_798;
  ProgramResult local_778;
  string local_748 [32];
  ulong local_728;
  size_t newSize;
  ProgramResult local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  allocator<char> local_609;
  string local_608 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  undefined1 local_5c8 [8];
  string currCommand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> pass;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_568 [7];
  bool more;
  ulong local_548;
  size_t oldSize;
  allocator<char> local_538;
  allocator<char> local_537;
  allocator<char> local_536;
  allocator<char> local_535;
  allocator<char> local_534;
  allocator<char> local_533;
  allocator<char> local_532;
  allocator<char> local_531;
  allocator<char> local_530;
  allocator<char> local_52f;
  allocator<char> local_52e;
  allocator<char> local_52d;
  allocator<char> local_52c;
  allocator<char> local_52b;
  allocator<char> local_52a;
  allocator<char> local_529;
  allocator<char> local_528;
  allocator<char> local_527;
  allocator<char> local_526;
  allocator<char> local_525;
  allocator<char> local_524;
  allocator<char> local_523;
  allocator<char> local_522;
  allocator<char> local_521;
  allocator<char> local_520;
  allocator<char> local_51f;
  allocator<char> local_51e;
  allocator<char> local_51d;
  allocator<char> local_51c;
  allocator<char> local_51b;
  allocator<char> local_51a;
  allocator<char> local_519;
  allocator<char> local_518;
  allocator<char> local_517;
  allocator<char> local_516;
  allocator<char> local_515 [20];
  allocator<char> local_501;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  string local_4d8 [32];
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passes;
  Reducer *this_local;
  
  oldSize._6_1_ = 1;
  local_500 = &local_4f8;
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"-Oz",&local_501);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4d8,"-Os",local_515);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4b8,"-O1",&local_516);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_498,"-O2",&local_517);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_478,"-O3",&local_518);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_458,"-O4",&local_519);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_438,"--flatten -Os",&local_51a);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_418,"--flatten -O3",&local_51b);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3f8,"--flatten --simplify-locals-notee-nostructure --local-cse -Os",&local_51c);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3d8,"--type-ssa -Os --type-merging",&local_51d);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3b8,"--gufa -O1",&local_51e);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_398,"--coalesce-locals --vacuum",&local_51f);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_378,"--dae",&local_520);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_358,"--dae-optimizing",&local_521);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_338,"--dce",&local_522);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_318,"--duplicate-function-elimination",&local_523);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f8,"--enclose-world",&local_524);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2d8,"--gto",&local_525);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2b8,"--inlining",&local_526);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_298,"--inlining-optimizing",&local_527);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_278,"--optimize-level=3 --inlining-optimizing",&local_528);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_258,"--local-cse",&local_529);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_238,"--memory-packing",&local_52a);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_218,"--remove-unused-names --merge-blocks --vacuum",&local_52b);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f8,"--optimize-instructions",&local_52c)
  ;
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d8,"--precompute",&local_52d);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,"--remove-imports",&local_52e);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_198,"--remove-memory-init",&local_52f);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"--remove-unused-names --remove-unused-brs",&local_530);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"--remove-unused-module-elements",&local_531);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"--remove-unused-nonfunction-module-elements",&local_532);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"--reorder-functions",&local_533);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"--reorder-locals",&local_534);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"--simplify-globals",&local_535);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"--simplify-locals --vacuum",&local_536);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,"--strip",&local_537);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"--remove-unused-types --closed-world",&local_538);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,"--vacuum",(allocator<char> *)((long)&oldSize + 7));
  oldSize._6_1_ = 0;
  local_38 = &local_4f8;
  local_30 = 0x26;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&oldSize + 5));
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&oldSize + 5));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&oldSize + 5));
  local_a10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
  do {
    local_a10 = local_a10 + -1;
    std::__cxx11::string::~string((string *)local_a10);
  } while (local_a10 != &local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&oldSize + 7));
  std::allocator<char>::~allocator(&local_538);
  std::allocator<char>::~allocator(&local_537);
  std::allocator<char>::~allocator(&local_536);
  std::allocator<char>::~allocator(&local_535);
  std::allocator<char>::~allocator(&local_534);
  std::allocator<char>::~allocator(&local_533);
  std::allocator<char>::~allocator(&local_532);
  std::allocator<char>::~allocator(&local_531);
  std::allocator<char>::~allocator(&local_530);
  std::allocator<char>::~allocator(&local_52f);
  std::allocator<char>::~allocator(&local_52e);
  std::allocator<char>::~allocator(&local_52d);
  std::allocator<char>::~allocator(&local_52c);
  std::allocator<char>::~allocator(&local_52b);
  std::allocator<char>::~allocator(&local_52a);
  std::allocator<char>::~allocator(&local_529);
  std::allocator<char>::~allocator(&local_528);
  std::allocator<char>::~allocator(&local_527);
  std::allocator<char>::~allocator(&local_526);
  std::allocator<char>::~allocator(&local_525);
  std::allocator<char>::~allocator(&local_524);
  std::allocator<char>::~allocator(&local_523);
  std::allocator<char>::~allocator(&local_522);
  std::allocator<char>::~allocator(&local_521);
  std::allocator<char>::~allocator(&local_520);
  std::allocator<char>::~allocator(&local_51f);
  std::allocator<char>::~allocator(&local_51e);
  std::allocator<char>::~allocator(&local_51d);
  std::allocator<char>::~allocator(&local_51c);
  std::allocator<char>::~allocator(&local_51b);
  std::allocator<char>::~allocator(&local_51a);
  std::allocator<char>::~allocator(&local_519);
  std::allocator<char>::~allocator(&local_518);
  std::allocator<char>::~allocator(&local_517);
  std::allocator<char>::~allocator(&local_516);
  std::allocator<char>::~allocator(local_515);
  std::allocator<char>::~allocator(&local_501);
  std::__cxx11::string::string(local_568,(string *)&this->working);
  uVar3 = wasm::file_size(local_568);
  std::__cxx11::string::~string(local_568);
  bVar1 = true;
  local_548 = uVar3;
  while (bVar1) {
    bVar1 = false;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_28);
    pass.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_28);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)((long)&pass.field_2 + 8)), bVar2) {
      pbVar4 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      std::__cxx11::string::string
                ((string *)(currCommand.field_2._M_local_buf + 8),(string *)pbVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_608,"wasm-opt",&local_609);
      wasm::Path::getBinaryenBinaryTool((string *)&local_5e8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8,
                     &local_5e8," ");
      std::__cxx11::string::~string((string *)&local_5e8);
      std::__cxx11::string::~string(local_608);
      std::allocator<char>::~allocator(&local_609);
      std::operator+(&local_6d0,&this->working," -o ");
      std::operator+(&local_6b0,&local_6d0,&this->test);
      std::operator+(&local_690,&local_6b0," ");
      std::operator+(&local_670,&local_690,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&currCommand.field_2 + 8));
      std::operator+(&local_650,&local_670," ");
      std::operator+(&local_630,&local_650,&extraFlags_abi_cxx11_);
      std::__cxx11::string::operator+=((string *)local_5c8,(string *)&local_630);
      std::__cxx11::string::~string((string *)&local_630);
      std::__cxx11::string::~string((string *)&local_650);
      std::__cxx11::string::~string((string *)&local_670);
      std::__cxx11::string::~string((string *)&local_690);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::__cxx11::string::~string((string *)&local_6d0);
      if ((this->binary & 1U) == 0) {
        std::__cxx11::string::operator+=((string *)local_5c8," -S ");
      }
      if ((this->verbose & 1U) != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"|    trying pass command: ");
        poVar5 = std::operator<<(poVar5,(string *)local_5c8);
        std::operator<<(poVar5,"\n");
      }
      std::__cxx11::string::string((string *)&newSize,(string *)local_5c8);
      ProgramResult::ProgramResult(&local_700,(string *)&newSize);
      bVar2 = ProgramResult::failed(&local_700);
      ProgramResult::~ProgramResult(&local_700);
      std::__cxx11::string::~string((string *)&newSize);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        std::__cxx11::string::string(local_748,(string *)&this->test);
        uVar3 = wasm::file_size(local_748);
        std::__cxx11::string::~string(local_748);
        local_728 = uVar3;
        if (uVar3 < local_548) {
          std::__cxx11::string::string((string *)&local_798,(string *)&this->command);
          ProgramResult::ProgramResult(&local_778,&local_798);
          bVar2 = ProgramResult::operator==(&local_778,&expected);
          ProgramResult::~ProgramResult(&local_778);
          std::__cxx11::string::~string((string *)&local_798);
          if (bVar2) {
            poVar5 = std::operator<<((ostream *)&std::cerr,"|    command \"");
            poVar5 = std::operator<<(poVar5,(string *)local_5c8);
            poVar5 = std::operator<<(poVar5,"\" succeeded, reduced size to ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_728);
            std::operator<<(poVar5,'\n');
            applyTestToWorking(this);
            bVar1 = true;
            local_548 = local_728;
          }
        }
      }
      std::__cxx11::string::~string((string *)local_5c8);
      std::__cxx11::string::~string((string *)(currCommand.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  if ((this->verbose & 1U) != 0) {
    std::operator<<((ostream *)&std::cerr,"|    done with passes for now\n");
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return;
}

Assistant:

void reduceUsingPasses() {
    // run optimization passes until we can't shrink it any more
    std::vector<std::string> passes = {
      // Optimization modes.
      "-Oz",
      "-Os",
      "-O1",
      "-O2",
      "-O3",
      "-O4",
      // Optimization modes + passes that work well with them.
      "--flatten -Os",
      "--flatten -O3",
      "--flatten --simplify-locals-notee-nostructure --local-cse -Os",
      "--type-ssa -Os --type-merging",
      "--gufa -O1",
      // Individual passes or combinations of them.
      "--coalesce-locals --vacuum",
      "--dae",
      "--dae-optimizing",
      "--dce",
      "--duplicate-function-elimination",
      "--enclose-world",
      "--gto",
      "--inlining",
      "--inlining-optimizing",
      "--optimize-level=3 --inlining-optimizing",
      "--local-cse",
      "--memory-packing",
      "--remove-unused-names --merge-blocks --vacuum",
      "--optimize-instructions",
      "--precompute",
      "--remove-imports",
      "--remove-memory-init",
      "--remove-unused-names --remove-unused-brs",
      "--remove-unused-module-elements",
      "--remove-unused-nonfunction-module-elements",
      "--reorder-functions",
      "--reorder-locals",
      // TODO: signature* passes
      "--simplify-globals",
      "--simplify-locals --vacuum",
      "--strip",
      "--remove-unused-types --closed-world",
      "--vacuum"};
    auto oldSize = file_size(working);
    bool more = true;
    while (more) {
      // std::cerr << "|    starting passes loop iteration\n";
      more = false;
      // try both combining with a generic shrink (so minor pass overhead is
      // compensated for), and without
      for (auto pass : passes) {
        std::string currCommand = Path::getBinaryenBinaryTool("wasm-opt") + " ";
        currCommand += working + " -o " + test + " " + pass + " " + extraFlags;
        if (!binary) {
          currCommand += " -S ";
        }
        if (verbose) {
          std::cerr << "|    trying pass command: " << currCommand << "\n";
        }
        if (!ProgramResult(currCommand).failed()) {
          auto newSize = file_size(test);
          if (newSize < oldSize) {
            // the pass didn't fail, and the size looks smaller, so promising
            // see if it is still has the property we are preserving
            if (ProgramResult(command) == expected) {
              std::cerr << "|    command \"" << currCommand
                        << "\" succeeded, reduced size to " << newSize << '\n';
              applyTestToWorking();
              more = true;
              oldSize = newSize;
            }
          }
        }
      }
    }
    if (verbose) {
      std::cerr << "|    done with passes for now\n";
    }
  }